

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qduplicatetracker_p.h
# Opt level: O2

void __thiscall
QDuplicateTracker<QString,32ul>::appendTo<QList<QString>>
          (QDuplicateTracker<QString,32ul> *this,QList<QString> *c)

{
  value_type *args;
  long in_FS_OFFSET;
  __buckets_ptr local_28;
  
  local_28 = *(__buckets_ptr *)(in_FS_OFFSET + 0x28);
  while (*(long *)(this + 0x668) != 0) {
    std::
    unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
    ::extract((unordered_set<QString,_QDuplicateTracker<QString,_32UL>::QHasher<QString>,_std::equal_to<QString>,_std::pmr::polymorphic_allocator<QString>_>
               *)&stack0xffffffffffffffc8,(const_iterator)((long)this + 0x640));
    args = std::
           _Node_handle<QString,_QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
           ::value((_Node_handle<QString,_QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
                    *)&stack0xffffffffffffffc8);
    QList<QString>::emplaceBack<QString>(c,args);
    std::
    _Node_handle_common<QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
    ::~_Node_handle_common
              ((_Node_handle_common<QString,_std::pmr::polymorphic_allocator<std::__detail::_Hash_node<QString,_true>_>_>
                *)&stack0xffffffffffffffc8);
  }
  if (*(__buckets_ptr *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendTo(C &c) &&
    {
        if constexpr (uses_pmr) {
            while (!set.empty())
                c.push_back(std::move(set.extract(set.begin()).value()));
        } else {
            return appendTo(c); // lvalue version
        }
    }